

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

int Dar2_LibBuildBest_rec(Gia_Man_t *p,Dar_LibObj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Gia_Obj_t *pObj_00;
  int Fill;
  Dar_LibDat_t *pDVar5;
  
  uVar4 = (ulong)*pObj >> 0x24;
  iVar1 = s_DarLib->pDatas[uVar4].field_0.iGunc;
  if (iVar1 < 0) {
    pDVar5 = s_DarLib->pDatas + uVar4;
    iVar1 = Dar2_LibBuildBest_rec
                      (p,(Dar_LibObj_t *)
                         (&s_DarLib->pObjs->field_0x0 + ((SUB84(*pObj,0) & 0xffff) << 3)));
    iVar2 = Dar2_LibBuildBest_rec(p,s_DarLib->pObjs + *(ushort *)&pObj->field_0x2);
    iVar1 = Abc_LitNotCond(iVar1,*(uint *)&pObj->field_0x4 & 1);
    iVar2 = Abc_LitNotCond(iVar2,SUB84(*pObj,4) >> 1 & 1);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
    (pDVar5->field_0).iGunc = iVar1;
    iVar1 = Abc_Lit2Var(iVar1);
    pObj_00 = Gia_ManObj(p,iVar1);
    uVar4 = *(ulong *)pObj_00 & 0x1fffffff;
    if (uVar4 != 0x1fffffff && -1 < (int)*(ulong *)pObj_00) {
      iVar2 = Gia_ObjLevel(p,pObj_00 + -uVar4);
      iVar1 = Gia_ObjLevel(p,pObj_00 + -(ulong)(*(uint *)&pObj_00->field_0x4 & 0x1fffffff));
      uVar3 = Gia_ObjId(p,pObj_00);
      p_00 = p->vLevels;
      Vec_IntFillExtra(p_00,uVar3 + 1,Fill);
      if (((int)uVar3 < 0) || (p_00->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      p_00->pArray[uVar3] = iVar1 + 1;
    }
    Gia_ObjSetPhase(p,pObj_00);
    iVar1 = (pDVar5->field_0).iGunc;
  }
  return iVar1;
}

Assistant:

int Dar2_LibBuildBest_rec( Gia_Man_t * p, Dar_LibObj_t * pObj )
{
    Gia_Obj_t * pNode;
    Dar_LibDat_t * pData;
    int iFanin0, iFanin1;
    pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->iGunc >= 0 )
        return pData->iGunc;
    iFanin0 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan0) );
    iFanin1 = Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan1) );
    iFanin0 = Abc_LitNotCond( iFanin0, pObj->fCompl0 );
    iFanin1 = Abc_LitNotCond( iFanin1, pObj->fCompl1 );
    pData->iGunc = Gia_ManHashAnd( p, iFanin0, iFanin1 );
    pNode = Gia_ManObj( p, Abc_Lit2Var(pData->iGunc) );
    if ( Gia_ObjIsAnd( pNode ) )
        Gia_ObjSetAndLevel( p, pNode );
    Gia_ObjSetPhase( p, pNode );
    return pData->iGunc;
}